

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-eintr-handling.c
# Opt level: O2

int run_test_eintr_handling(void)

{
  uv_loop_t *loop;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  uv_thread_t thread;
  thread_ctx ctx;
  uv_signal_t signal;
  
  iov = uv_buf_init(buf,0x20);
  ::loop = uv_default_loop();
  iVar1 = uv_signal_init(::loop,&signal);
  ctx.barrier.__align = (long)iVar1;
  thread = 0;
  if (ctx.barrier.__align == 0) {
    iVar1 = uv_signal_start(&signal,sig_func,10);
    ctx.barrier.__align = (long)iVar1;
    thread = 0;
    if (ctx.barrier.__align == 0) {
      iVar1 = pipe(pipe_fds);
      ctx.barrier.__align = (long)iVar1;
      thread = 0;
      if (ctx.barrier.__align == 0) {
        iVar1 = uv_thread_create(&thread,thread_main,&ctx);
        eval_a_3 = (int64_t)iVar1;
        eval_b_3 = 0;
        if (eval_a_3 == 0) {
          iVar1 = uv_fs_read(::loop,&read_req,pipe_fds[0],&iov,1,-1,(uv_fs_cb)0x0);
          eval_a_3 = (int64_t)iVar1;
          eval_b_3 = 0xd;
          if (eval_a_3 == 0xd) {
            iVar1 = strcmp(buf,test_buf);
            eval_a_3 = (int64_t)iVar1;
            eval_b_3 = 0;
            if (eval_a_3 == 0) {
              iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
              eval_a_3 = (int64_t)iVar1;
              eval_b_3 = 0;
              if (eval_a_3 == 0) {
                iVar1 = close(pipe_fds[0]);
                eval_a_3 = (int64_t)iVar1;
                eval_b_3 = 0;
                if (eval_a_3 == 0) {
                  iVar1 = close(pipe_fds[1]);
                  eval_a_3 = (int64_t)iVar1;
                  eval_b_3 = 0;
                  if (eval_a_3 == 0) {
                    uv_close((uv_handle_t *)&signal,(uv_close_cb)0x0);
                    iVar1 = uv_thread_join(&thread);
                    loop = ::loop;
                    eval_a_3 = (int64_t)iVar1;
                    eval_b_3 = 0;
                    if (eval_a_3 == 0) {
                      uv_walk(::loop,close_walk_cb,(void *)0x0);
                      uv_run(loop,UV_RUN_DEFAULT);
                      eval_a_3 = 0;
                      iVar1 = uv_loop_close(::loop);
                      eval_b_3 = (int64_t)iVar1;
                      if (eval_b_3 == 0) {
                        uv_library_shutdown();
                        return 0;
                      }
                      pcVar3 = "uv_loop_close(loop)";
                      pcVar2 = "0";
                      uVar4 = 0x5c;
                    }
                    else {
                      pcVar3 = "0";
                      pcVar2 = "uv_thread_join(&thread)";
                      uVar4 = 0x5a;
                    }
                  }
                  else {
                    pcVar3 = "0";
                    pcVar2 = "close(pipe_fds[1])";
                    uVar4 = 0x57;
                  }
                }
                else {
                  pcVar3 = "0";
                  pcVar2 = "close(pipe_fds[0])";
                  uVar4 = 0x56;
                }
              }
              else {
                pcVar3 = "0";
                pcVar2 = "uv_run(loop, UV_RUN_DEFAULT)";
                uVar4 = 0x54;
              }
            }
            else {
              pcVar3 = "0";
              pcVar2 = "strcmp(buf, test_buf)";
              uVar4 = 0x52;
            }
          }
          else {
            pcVar3 = "sizeof(test_buf)";
            pcVar2 = "nread";
            uVar4 = 0x51;
          }
        }
        else {
          pcVar3 = "0";
          pcVar2 = "uv_thread_create(&thread, thread_main, &ctx)";
          uVar4 = 0x4d;
        }
        goto LAB_00118246;
      }
      pcVar2 = "pipe(pipe_fds)";
      uVar4 = 0x4c;
    }
    else {
      pcVar2 = "uv_signal_start(&signal, sig_func, 10)";
      uVar4 = 0x4a;
    }
  }
  else {
    pcVar2 = "uv_signal_init(loop, &signal)";
    uVar4 = 0x49;
  }
  thread = 0;
  pcVar3 = "0";
  eval_b_3 = 0;
  eval_a_3 = ctx.barrier.__align;
LAB_00118246:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-eintr-handling.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a_3,"==",eval_b_3);
  abort();
}

Assistant:

TEST_IMPL(eintr_handling) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int nread;

  iov = uv_buf_init(buf, sizeof(buf));
  loop = uv_default_loop();

  ASSERT_OK(uv_signal_init(loop, &signal));
  ASSERT_OK(uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT_OK(pipe(pipe_fds));
  ASSERT_OK(uv_thread_create(&thread, thread_main, &ctx));

  nread = uv_fs_read(loop, &read_req, pipe_fds[0], &iov, 1, -1, NULL);

  ASSERT_EQ(nread, sizeof(test_buf));
  ASSERT_OK(strcmp(buf, test_buf));

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_OK(close(pipe_fds[0]));
  ASSERT_OK(close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  ASSERT_OK(uv_thread_join(&thread));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}